

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  uchar *puVar1;
  uchar uVar2;
  unsigned_short grey;
  uchar uVar5;
  int iVar3;
  size_t sVar4;
  uchar uVar8;
  size_t sVar7;
  uint bits;
  uint uVar9;
  uchar uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_d8;
  unsigned_short local_d6;
  unsigned_short local_d4;
  unsigned_short local_d2;
  uchar *local_d0;
  ulong local_c8;
  LodePNGColorMode *local_c0;
  ColorTree local_b8;
  uchar uVar6;
  
  iVar3 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar3 != 0) {
    sVar4 = lodepng_get_raw_size(w,h,mode_in);
    if (sVar4 == 0) {
      return 0;
    }
    sVar7 = 0;
    do {
      out[sVar7] = in[sVar7];
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
    return 0;
  }
  local_c8 = (ulong)(h * w);
  local_c0 = mode_in;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar11 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    uVar13 = mode_out->palettesize;
    if (uVar13 < uVar11) {
      uVar11 = uVar13;
    }
    local_b8.children[0xe] = (ColorTree *)0x0;
    local_b8.children[0xf] = (ColorTree *)0x0;
    local_b8.children[0xc] = (ColorTree *)0x0;
    local_b8.children[0xd] = (ColorTree *)0x0;
    local_b8.children[10] = (ColorTree *)0x0;
    local_b8.children[0xb] = (ColorTree *)0x0;
    local_b8.children[8] = (ColorTree *)0x0;
    local_b8.children[9] = (ColorTree *)0x0;
    local_b8.children[6] = (ColorTree *)0x0;
    local_b8.children[7] = (ColorTree *)0x0;
    local_b8.children[4] = (ColorTree *)0x0;
    local_b8.children[5] = (ColorTree *)0x0;
    local_b8.children[2] = (ColorTree *)0x0;
    local_b8.children[3] = (ColorTree *)0x0;
    local_b8.children[0] = (ColorTree *)0x0;
    local_b8.children[1] = (ColorTree *)0x0;
    local_b8.index = -1;
    if (uVar13 != 0) {
      uVar13 = 0;
      do {
        puVar1 = mode_out->palette;
        color_tree_add(&local_b8,puVar1[uVar13 * 4],puVar1[uVar13 * 4 + 1],puVar1[uVar13 * 4 + 2],
                       puVar1[uVar13 * 4 + 3],(uint)uVar13);
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  if (mode_out->bitdepth == 0x10 && local_c0->bitdepth == 0x10) {
    local_d0 = out;
    if (local_c8 != 0) {
      lVar12 = 0;
      sVar4 = 0;
      do {
        local_d2 = 0;
        local_d4 = 0;
        local_d6 = 0;
        local_d8 = 0;
        getPixelColorRGBA16(&local_d2,&local_d4,&local_d6,&local_d8,in,sVar4,local_c0);
        uVar2 = (uchar)local_d2;
        uVar5 = (uchar)(local_d2 >> 8);
        uVar8 = (uchar)(local_d8 >> 8);
        uVar10 = (uchar)(local_d4 >> 8);
        uVar6 = (uchar)(local_d6 >> 8);
        switch(mode_out->colortype) {
        case LCT_GREY:
          *(unsigned_short *)(local_d0 + sVar4 * 2) = local_d2 << 8 | local_d2 >> 8;
          break;
        case LCT_RGB:
          local_d0[lVar12] = uVar5;
          local_d0[lVar12 + 1] = uVar2;
          local_d0[lVar12 + 2] = uVar10;
          local_d0[lVar12 + 3] = (uchar)local_d4;
          local_d0[lVar12 + 4] = uVar6;
          local_d0[lVar12 + 5] = (uchar)local_d6;
          break;
        case LCT_GREY_ALPHA:
          local_d0[sVar4 * 4] = uVar5;
          local_d0[sVar4 * 4 + 1] = uVar2;
          local_d0[sVar4 * 4 + 2] = uVar8;
          local_d0[sVar4 * 4 + 3] = (uchar)local_d8;
          break;
        case LCT_RGBA:
          local_d0[sVar4 * 8] = uVar5;
          local_d0[sVar4 * 8 + 1] = uVar2;
          local_d0[sVar4 * 8 + 2] = uVar10;
          local_d0[sVar4 * 8 + 3] = (uchar)local_d4;
          local_d0[sVar4 * 8 + 4] = uVar6;
          local_d0[sVar4 * 8 + 5] = (uchar)local_d6;
          local_d0[sVar4 * 8 + 6] = uVar8;
          local_d0[sVar4 * 8 + 7] = (uchar)local_d8;
        }
        sVar4 = sVar4 + 1;
        lVar12 = lVar12 + 6;
      } while (local_c8 != sVar4);
    }
    goto LAB_001a7129;
  }
  if (mode_out->bitdepth == 8) {
    if (mode_out->colortype == LCT_RGB) {
      uVar9 = 0;
    }
    else {
      if (mode_out->colortype != LCT_RGBA) goto LAB_001a6f43;
      uVar9 = 1;
    }
    getPixelColorsRGBA8(out,local_c8,uVar9,in,local_c0);
  }
  else {
LAB_001a6f43:
    local_d2 = local_d2 & 0xff00;
    local_d4 = local_d4 & 0xff00;
    local_d6 = local_d6 & 0xff00;
    local_d8 = local_d8 & 0xff00;
    if (local_c8 != 0) {
      lVar12 = 1;
      lVar14 = 0;
      sVar4 = 0;
      do {
        getPixelColorRGBA8((uchar *)&local_d2,(uchar *)&local_d4,(uchar *)&local_d6,
                           (uchar *)&local_d8,in,sVar4,local_c0);
        switch(mode_out->colortype) {
        case LCT_GREY:
          bits = mode_out->bitdepth;
          if (bits == 0x10) {
            out[lVar12] = (byte)local_d2;
            out[lVar12 + -1] = (byte)local_d2;
          }
          else if (bits == 8) {
            out[sVar4] = (byte)local_d2;
          }
          else {
            uVar9 = ~(-1 << ((byte)bits & 0x1f)) & (uint)((byte)local_d2 >> (8 - (byte)bits & 0x1f))
            ;
LAB_001a70f1:
            addColorBits(out,sVar4,bits,uVar9);
          }
          break;
        case LCT_RGB:
          if (mode_out->bitdepth == 8) {
            out[lVar14] = (byte)local_d2;
            out[lVar14 + 1] = (uchar)local_d4;
            out[lVar14 + 2] = (uchar)local_d6;
          }
          else {
            out[lVar14 * 2 + 1] = (byte)local_d2;
            out[lVar14 * 2] = (byte)local_d2;
            out[lVar14 * 2 + 3] = (uchar)local_d4;
            out[lVar14 * 2 + 2] = (uchar)local_d4;
            out[lVar14 * 2 + 5] = (uchar)local_d6;
            out[lVar14 * 2 + 4] = (uchar)local_d6;
          }
          break;
        case LCT_PALETTE:
          uVar9 = color_tree_get(&local_b8,(byte)local_d2,(uchar)local_d4,(uchar)local_d6,
                                 (uchar)local_d8);
          if (-1 < (int)uVar9) {
            bits = mode_out->bitdepth;
            if (bits != 8) goto LAB_001a70f1;
            out[sVar4] = (uchar)uVar9;
          }
          break;
        case LCT_GREY_ALPHA:
          if (mode_out->bitdepth == 0x10) {
            out[lVar12 * 2 + -1] = (byte)local_d2;
            out[lVar12 * 2 + -2] = (byte)local_d2;
            out[lVar12 * 2 + 1] = (uchar)local_d8;
            out[lVar12 * 2] = (uchar)local_d8;
          }
          else if (mode_out->bitdepth == 8) {
            out[lVar12 + -1] = (byte)local_d2;
            out[lVar12] = (uchar)local_d8;
          }
          break;
        case LCT_RGBA:
          if (mode_out->bitdepth == 8) {
            out[lVar12 * 2 + -2] = (byte)local_d2;
            out[lVar12 * 2 + -1] = (uchar)local_d4;
            out[lVar12 * 2] = (uchar)local_d6;
            out[lVar12 * 2 + 1] = (uchar)local_d8;
          }
          else {
            out[lVar12 * 4 + -3] = (byte)local_d2;
            out[lVar12 * 4 + -4] = (byte)local_d2;
            out[lVar12 * 4 + -1] = (uchar)local_d4;
            out[lVar12 * 4 + -2] = (uchar)local_d4;
            out[lVar12 * 4 + 1] = (uchar)local_d6;
            out[lVar12 * 4] = (uchar)local_d6;
            out[lVar12 * 4 + 3] = (uchar)local_d8;
            out[lVar12 * 4 + 2] = (uchar)local_d8;
          }
        }
        sVar4 = sVar4 + 1;
        lVar12 = lVar12 + 2;
        lVar14 = lVar14 + 3;
      } while (local_c8 != sVar4);
    }
  }
LAB_001a7129:
  if (mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&local_b8);
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palsize = 1u << mode_out->bitdepth;
    if(mode_out->palettesize < palsize) palsize = mode_out->palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      unsigned char* p = &mode_out->palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error (this function currently never has one, but maybe OOM detection added later.)*/
}